

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.c
# Opt level: O2

int xmlParseEnumeratedType(xmlParserCtxtPtr ctxt,xmlEnumerationPtr *tree)

{
  xmlParserInputPtr in;
  xmlChar *pxVar1;
  int iVar2;
  xmlEnumerationPtr pxVar3;
  
  in = ctxt->input;
  pxVar1 = in->cur;
  if (((((*pxVar1 == 'N') && (pxVar1[1] == 'O')) && (pxVar1[2] == 'T')) &&
      ((pxVar1[3] == 'A' && (pxVar1[4] == 'T')))) &&
     ((pxVar1[5] == 'I' && ((pxVar1[6] == 'O' && (pxVar1[7] == 'N')))))) {
    in->cur = pxVar1 + 8;
    in->col = in->col + 8;
    if (pxVar1[8] == '\0') {
      xmlParserInputGrow(in,0xfa);
    }
    iVar2 = xmlSkipBlankChars(ctxt);
    if (iVar2 == 0) {
      xmlFatalErrMsg(ctxt,XML_ERR_SPACE_REQUIRED,"Space required after \'NOTATION\'\n");
      iVar2 = 0;
    }
    else {
      pxVar3 = xmlParseNotationType(ctxt);
      *tree = pxVar3;
      iVar2 = 10;
      if (pxVar3 == (xmlEnumerationPtr)0x0) {
        iVar2 = 0;
      }
    }
  }
  else {
    pxVar3 = xmlParseEnumerationType(ctxt);
    *tree = pxVar3;
    iVar2 = (uint)(pxVar3 != (xmlEnumerationPtr)0x0) * 9;
  }
  return iVar2;
}

Assistant:

int
xmlParseEnumeratedType(xmlParserCtxtPtr ctxt, xmlEnumerationPtr *tree) {

    DEBUG_ENTER(("xmlParseEnumeratedType(%s, %p);\n", dbgCtxt(ctxt), tree));

    if (CMP8(CUR_PTR, 'N', 'O', 'T', 'A', 'T', 'I', 'O', 'N')) {
	SKIP(8);
	if (SKIP_BLANKS == 0) {
	    xmlFatalErrMsg(ctxt, XML_ERR_SPACE_REQUIRED,
			   "Space required after 'NOTATION'\n");
	    RETURN_INT(0);
	}
	*tree = xmlParseNotationType(ctxt);
	if (*tree == NULL) RETURN_INT(0);
	RETURN_INT(XML_ATTRIBUTE_NOTATION);
    }
    *tree = xmlParseEnumerationType(ctxt);
    if (*tree == NULL) RETURN_INT(0);
    RETURN_INT(XML_ATTRIBUTE_ENUMERATION);
}